

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O0

pair<int,_int>
calcSup(vector<SoftNode,_std::allocator<SoftNode>_> *sc1,
       vector<SoftNode,_std::allocator<SoftNode>_> *sc2)

{
  bool bVar1;
  reference pSVar2;
  pair<int,_int> pVar3;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  _Self local_318;
  _Self local_310;
  undefined1 local_308 [8];
  SoftNode sn_3;
  const_iterator __end1_3;
  const_iterator __begin1_3;
  vector<SoftNode,_std::allocator<SoftNode>_> *__range1_3;
  _Self local_270;
  undefined1 local_268 [8];
  SoftNode sn_2;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<SoftNode,_std::allocator<SoftNode>_> *__range1_2;
  int scCo;
  int srCo;
  undefined1 local_1c8;
  undefined1 local_1c0 [8];
  SoftNode sn_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<SoftNode,_std::allocator<SoftNode>_> *__range1_1;
  undefined1 local_110 [8];
  SoftNode sn;
  const_iterator __end1;
  const_iterator __begin1;
  vector<SoftNode,_std::allocator<SoftNode>_> *__range1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  st2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  st1;
  vector<SoftNode,_std::allocator<SoftNode>_> *sc2_local;
  vector<SoftNode,_std::allocator<SoftNode>_> *sc1_local;
  
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&st2._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&__range1);
  __end1 = std::vector<SoftNode,_std::allocator<SoftNode>_>::begin(sc1);
  sn._112_8_ = std::vector<SoftNode,_std::allocator<SoftNode>_>::end(sc1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>
                                     *)&sn.scAtRight), bVar1) {
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>
             ::operator*(&__end1);
    SoftNode::SoftNode((SoftNode *)local_110,pSVar2);
    if ((sn.readName.field_2._M_local_buf[9] & 1U) == 0) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&st2._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (value_type *)((long)&sn.seq.field_2 + 8));
    }
    SoftNode::~SoftNode((SoftNode *)local_110);
    __gnu_cxx::
    __normal_iterator<const_SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>::
    operator++(&__end1);
  }
  __end1_1 = std::vector<SoftNode,_std::allocator<SoftNode>_>::begin(sc2);
  sn_1._112_8_ = std::vector<SoftNode,_std::allocator<SoftNode>_>::end(sc2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>
                             *)&sn_1.scAtRight), bVar1) {
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>
             ::operator*(&__end1_1);
    SoftNode::SoftNode((SoftNode *)local_1c0,pSVar2);
    if ((sn_1.readName.field_2._M_local_buf[9] & 1U) == 0) {
      pVar4 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range1,(value_type *)((long)&sn_1.seq.field_2 + 8));
      _scCo = pVar4.first._M_node;
      local_1c8 = pVar4.second;
    }
    SoftNode::~SoftNode((SoftNode *)local_1c0);
    __gnu_cxx::
    __normal_iterator<const_SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>::
    operator++(&__end1_1);
  }
  __range1_2._4_4_ = 0;
  __range1_2._0_4_ = 0;
  __end1_2 = std::vector<SoftNode,_std::allocator<SoftNode>_>::begin(sc1);
  sn_2._112_8_ = std::vector<SoftNode,_std::allocator<SoftNode>_>::end(sc1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<const_SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>
                             *)&sn_2.scAtRight), bVar1) {
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>
             ::operator*(&__end1_2);
    SoftNode::SoftNode((SoftNode *)local_268,pSVar2);
    if ((sn_2.readName.field_2._M_local_buf[9] & 1U) != 0) {
      local_270._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range1,(key_type *)((long)&sn_2.seq.field_2 + 8));
      __range1_3 = (vector<SoftNode,_std::allocator<SoftNode>_> *)
                   std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range1);
      bVar1 = std::operator!=(&local_270,(_Self *)&__range1_3);
      if (bVar1) {
        __range1_2._4_4_ = __range1_2._4_4_ + 1;
      }
      else {
        __range1_2._0_4_ = (int)__range1_2 + 1;
      }
    }
    SoftNode::~SoftNode((SoftNode *)local_268);
    __gnu_cxx::
    __normal_iterator<const_SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>::
    operator++(&__end1_2);
  }
  __end1_3 = std::vector<SoftNode,_std::allocator<SoftNode>_>::begin(sc2);
  sn_3._112_8_ = std::vector<SoftNode,_std::allocator<SoftNode>_>::end(sc2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_3,
                            (__normal_iterator<const_SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>
                             *)&sn_3.scAtRight), bVar1) {
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>
             ::operator*(&__end1_3);
    SoftNode::SoftNode((SoftNode *)local_308,pSVar2);
    if ((sn_3.readName.field_2._M_local_buf[9] & 1U) != 0) {
      local_310._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&st2._M_t._M_impl.super__Rb_tree_header._M_node_count,
                  (key_type *)((long)&sn_3.seq.field_2 + 8));
      local_318._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&st2._M_t._M_impl.super__Rb_tree_header._M_node_count);
      bVar1 = std::operator!=(&local_310,&local_318);
      if (bVar1) {
        __range1_2._4_4_ = __range1_2._4_4_ + 1;
      }
      else {
        __range1_2._0_4_ = (int)__range1_2 + 1;
      }
    }
    SoftNode::~SoftNode((SoftNode *)local_308);
    __gnu_cxx::
    __normal_iterator<const_SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>::
    operator++(&__end1_3);
  }
  pVar3 = std::make_pair<int&,int&>((int *)((long)&__range1_2 + 4),(int *)&__range1_2);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&__range1);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&st2._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return pVar3;
}

Assistant:

std::pair<int, int> calcSup(const std::vector<SoftNode> &sc1, const std::vector<SoftNode> &sc2)
{
	std::set<std::string> st1, st2;
	for (SoftNode sn : sc1)
	{
		if (!sn.isSC)
			st1.insert(sn.readName);
	}
	for (SoftNode sn : sc2)
	{
		if (!sn.isSC)
			st2.insert(sn.readName);
	}
	int srCo = 0, scCo = 0;
	for (SoftNode sn : sc1)
	{
		if (sn.isSC)
		{
			if (st2.find(sn.readName) != st2.end())
				srCo += 1;
			else
				scCo += 1;
		}
	}
	for (SoftNode sn : sc2)
	{
		if (sn.isSC)
		{
			if (st1.find(sn.readName) != st1.end())
				srCo += 1;
			else
				scCo += 1;
		}
	}
	return std::make_pair(srCo, scCo);
}